

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void __thiscall
ColumnSampler<double>::leave_m_cols
          (ColumnSampler<double> *this,size_t m,Xoshiro256PP *rnd_generator)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  result_type rVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  size_t sVar10;
  ulong uVar11;
  _Adaptor<Xoshiro::Xoshiro256PP,_double> __aurng;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<double,_std::allocator<double>_> curr_weights;
  vector<double,_std::allocator<double>_> local_60;
  size_t local_48;
  double local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  if ((m != 0) && (uVar5 = this->n_cols, m < uVar5)) {
    if ((this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (uVar5 >> 2 < m) {
        auVar14._8_4_ = (int)(m >> 0x20);
        auVar14._0_8_ = m;
        auVar14._12_4_ = 0x45300000;
        auVar15._8_4_ = (int)(uVar5 >> 0x20);
        auVar15._0_8_ = uVar5;
        auVar15._12_4_ = 0x45300000;
        if (((auVar15._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) * 0.75 <=
            (auVar14._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)m) - 4503599627370496.0)) {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(uVar5 - 1);
          this->curr_pos =
               (size_t)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
          if ((pointer)(this->n_cols - m) <
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            do {
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                                ((uniform_int_distribution<unsigned_long> *)&local_60,rnd_generator,
                                 (param_type *)&local_60);
              puVar3 = (this->col_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start;
              sVar10 = this->curr_pos;
              uVar4 = puVar3[rVar6];
              puVar3[rVar6] = puVar3[sVar10];
              puVar3[sVar10] = uVar4;
              local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)(this->curr_pos - 1);
              this->curr_pos =
                   (size_t)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish;
            } while ((pointer)(this->n_cols - m) <
                     local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish);
          }
        }
        else {
          std::
          shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,Xoshiro::Xoshiro256PP&>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(this->col_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(this->col_indices).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_finish,rnd_generator);
        }
        this->curr_pos = m;
      }
      else {
        this->curr_pos = 0;
        uVar5 = 0;
        do {
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)(~uVar5 + this->n_cols);
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          rVar6 = std::uniform_int_distribution<unsigned_long>::operator()
                            ((uniform_int_distribution<unsigned_long> *)&local_60,rnd_generator,
                             (param_type *)&local_60);
          puVar3 = (this->col_indices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + this->curr_pos;
          uVar4 = puVar3[rVar6];
          puVar3[rVar6] = *puVar3;
          *puVar3 = uVar4;
          uVar5 = this->curr_pos + 1;
          this->curr_pos = uVar5;
        } while (uVar5 < m);
      }
    }
    else {
      local_38 = &this->tree_weights;
      std::vector<double,_std::allocator<double>_>::vector(&local_60,local_38);
      pdVar1 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar2 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (pdVar1 != pdVar2) {
        memset(pdVar1,0,((long)pdVar2 + (-8 - (long)pdVar1) & 0xfffffffffffffff8U) + 8);
      }
      sVar10 = 0;
      local_48 = m;
      do {
        local_40 = *local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        if (local_40 <= 0.0) {
          iVar9 = 0xb;
          if (sVar10 == 0) {
            iVar9 = 1;
            drop_weights(this);
            sVar10 = local_48;
          }
          goto LAB_0016613b;
        }
        if (this->tree_levels == 0) {
          uVar7 = 0;
          uVar5 = 0;
        }
        else {
          uVar11 = 0;
          uVar7 = 0;
          do {
            dVar13 = std::generate_canonical<double,53ul,Xoshiro::Xoshiro256PP>(rnd_generator);
            uVar7 = (uVar7 * 2 + 2) -
                    (ulong)(dVar13 * local_40 + 0.0 <
                           local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7 * 2 + 1]);
            local_40 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7];
            uVar11 = uVar11 + 1;
            uVar5 = this->tree_levels;
          } while (uVar11 < uVar5);
        }
        (local_38->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] =
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7];
        local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar7] = 0.0;
        for (; uVar5 != 0; uVar5 = uVar5 - 1) {
          uVar11 = uVar7 * 8 - 8 | 8;
          uVar7 = uVar7 - 1 >> 1;
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] =
               *(double *)
                ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11) +
               *(double *)
                ((long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar11 + 8);
        }
        sVar10 = sVar10 + 1;
      } while (sVar10 != m + (m == 0));
      iVar9 = 8;
      sVar10 = local_48;
LAB_0016613b:
      if ((iVar9 == 0xb) || (iVar9 == 8)) {
        pdVar1 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar8 = (long)(this->tree_weights).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
        if (lVar8 != 1) {
          uVar5 = lVar8 - 2;
          do {
            *(double *)((long)pdVar1 + (uVar5 & 0xfffffffffffffffe) * 4) =
                 pdVar1[uVar5 + 1] + *(double *)((long)pdVar1 + (uVar5 & 0xfffffffffffffffe) * 4);
            bVar12 = uVar5 != 0;
            uVar5 = uVar5 - 1;
          } while (bVar12);
        }
        this->n_dropped = this->n_cols - sVar10;
      }
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void ColumnSampler<ldouble_safe>::leave_m_cols(size_t m, RNG_engine &rnd_generator)
{
    if (m == 0 || m >= this->n_cols)
        return;

    if (!this->has_weights())
    {
        size_t chosen;
        if (m <= this->n_cols / 4)
        {
            for (this->curr_pos = 0; this->curr_pos < m; this->curr_pos++)
            {
                chosen = std::uniform_int_distribution<size_t>(0, this->n_cols - this->curr_pos - 1)(rnd_generator);
                std::swap(this->col_indices[this->curr_pos + chosen], this->col_indices[this->curr_pos]);
            }
        }

        else if ((ldouble_safe)m >= (ldouble_safe)(3./4.) * (ldouble_safe)this->n_cols)
        {
            for (this->curr_pos = this->n_cols-1; this->curr_pos > this->n_cols - m; this->curr_pos--)
            {
                chosen = std::uniform_int_distribution<size_t>(0, this->curr_pos)(rnd_generator);
                std::swap(this->col_indices[chosen], this->col_indices[this->curr_pos]);
            }
            this->curr_pos = m;
        }

        else
        {
            std::shuffle(this->col_indices.begin(), this->col_indices.end(), rnd_generator);
            this->curr_pos = m;
        }
    }

    else
    {
        std::vector<double> curr_weights = this->tree_weights;
        std::fill(this->tree_weights.begin(), this->tree_weights.end(), 0.);
        double rnd_subrange, w_left;
        double curr_subrange;
        size_t curr_ix;

        for (size_t col = 0; col < m; col++)
        {
            curr_ix = 0;
            curr_subrange = curr_weights[0];
            if (curr_subrange <= 0)
            {
                if (col == 0)
                {
                    this->drop_weights();
                    return;
                }

                else
                {
                    m = col;
                    goto rebuild_tree;
                }
            }

            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
                w_left = curr_weights[ix_child(curr_ix)];
                curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
                curr_subrange = curr_weights[curr_ix];
            }

            this->tree_weights[curr_ix] = curr_weights[curr_ix];

            /* now remove the weight of the chosen element */
            curr_weights[curr_ix] = 0;
            for (size_t lev = 0; lev < this->tree_levels; lev++)
            {
                curr_ix = ix_parent(curr_ix);
                curr_weights[curr_ix] =   curr_weights[ix_child(curr_ix)]
                                        + curr_weights[ix_child(curr_ix) + 1];
            }
        }

        /* rebuild the tree after getting new weights */
        rebuild_tree:
        for (size_t ix = this->tree_weights.size() - 1; ix > 0; ix--)
            this->tree_weights[ix_parent(ix)] += this->tree_weights[ix];

        this->n_dropped = this->n_cols - m;
    }
}